

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

Vec_Ptr_t * Bac_PtrDeriveFromCba(Bac_Man_t *p)

{
  uint uVar1;
  char *pcVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  if (p != (Bac_Man_t *)0x0) {
    if (p->pMioLib != (void *)0x0) {
      Bac_ManAssignInternWordNames(p);
      if (p->nNtks < -1) {
        __assert_fail("nCap >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
      }
      uVar6 = p->nNtks + 1;
      pVVar3 = (Vec_Ptr_t *)malloc(0x10);
      pVVar3->nSize = 0;
      pVVar3->nCap = uVar6;
      if (uVar6 == 0) {
        ppvVar4 = (void **)0x0;
      }
      else {
        ppvVar4 = (void **)malloc((ulong)uVar6 << 3);
      }
      pVVar3->pArray = ppvVar4;
      pcVar2 = p->pName;
      if (uVar6 == 0) {
        if (ppvVar4 == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(ppvVar4,0x80);
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = 0x10;
      }
      pVVar3->nSize = 1;
      *pVVar3->pArray = pcVar2;
      if (0 < p->nNtks) {
        lVar8 = 0xd0;
        lVar9 = 0;
        do {
          pVVar5 = Bac_NtkTransformToPtr((Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar8));
          uVar6 = pVVar3->nSize;
          uVar1 = pVVar3->nCap;
          if (uVar6 == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
              }
              iVar7 = 0x10;
            }
            else {
              iVar7 = uVar1 * 2;
              if (iVar7 <= (int)uVar1) goto LAB_003951be;
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
              }
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = iVar7;
          }
LAB_003951be:
          pVVar3->nSize = uVar6 + 1;
          pVVar3->pArray[(int)uVar6] = pVVar5;
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0xd0;
        } while (lVar9 < p->nNtks);
      }
      if (pVVar3->nSize == pVVar3->nCap) {
        return pVVar3;
      }
      __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
    }
    puts("Cannot transform CBA network into Ptr because it is not mapped.");
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Bac_PtrDeriveFromCba( Bac_Man_t * p )
{
    Vec_Ptr_t * vDes;
    Bac_Ntk_t * pTemp; int i;
    if ( p == NULL )
        return NULL;
    if ( p->pMioLib == NULL )
    {
        printf( "Cannot transform CBA network into Ptr because it is not mapped.\n" );
        return NULL;
    }
    Bac_ManAssignInternWordNames( p );
    vDes = Vec_PtrAllocExact( 1 + Bac_ManNtkNum(p) );
    Vec_PtrPush( vDes, p->pName );
    Bac_ManForEachNtk( p, pTemp, i )
        Vec_PtrPush( vDes, Bac_NtkTransformToPtr(pTemp) );
    assert( Ptr_CheckArray(vDes) );
    return vDes;
}